

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall
caffe::ThresholdParameter::InternalSwap(ThresholdParameter *this,ThresholdParameter *other)

{
  float fVar1;
  uint32 uVar2;
  int iVar3;
  void *pvVar4;
  UnknownFieldSet *other_00;
  
  fVar1 = this->threshold_;
  this->threshold_ = other->threshold_;
  other->threshold_ = fVar1;
  uVar2 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar2;
  pvVar4 = (other->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    if (((ulong)pvVar4 & 1) == 0) goto LAB_004aa0b3;
LAB_004aa0a6:
    other_00 = (UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe);
  }
  else {
    if (((ulong)pvVar4 & 1) != 0) goto LAB_004aa0a6;
    other_00 = google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(other->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
  }
  google::protobuf::internal::InternalMetadataWithArena::DoSwap(&this->_internal_metadata_,other_00)
  ;
LAB_004aa0b3:
  iVar3 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar3;
  return;
}

Assistant:

void ThresholdParameter::InternalSwap(ThresholdParameter* other) {
  std::swap(threshold_, other->threshold_);
  std::swap(_has_bits_[0], other->_has_bits_[0]);
  _internal_metadata_.Swap(&other->_internal_metadata_);
  std::swap(_cached_size_, other->_cached_size_);
}